

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

RunnerContext * GetNextContext(Runner *runner)

{
  int local_14;
  int i;
  Runner *runner_local;
  
  local_14 = 0;
  while( true ) {
    if (runner->totalContexts <= local_14) {
      printf("%s\n","Ran out of contexts");
      exit(0);
    }
    if ((runner->contextUsed[local_14] & 1U) == 0) break;
    local_14 = local_14 + 1;
  }
  runner->contextUsed[local_14] = true;
  return runner->contexts + local_14;
}

Assistant:

RunnerContext* GetNextContext(Runner* runner) {
  for (int i = 0; i < runner->totalContexts; i++) {
    if (!runner->contextUsed[i]) {
      runner->contextUsed[i] = true;
      return &runner->contexts[i];  
    }
  }

  RUNTIME_ERROR("Ran out of contexts");
}